

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

yyjson_mut_val *
duckdb_yyjson::yyjson_mut_patch
          (yyjson_mut_doc *doc,yyjson_mut_val *orig,yyjson_mut_val *patch,yyjson_patch_err *err)

{
  bool bVar1;
  patch_op pVar2;
  yyjson_ptr_code yVar3;
  yyjson_ptr_err *err_00;
  char **ppcVar4;
  ulong *puVar5;
  ulong *puVar6;
  yyjson_mut_val *pyVar7;
  yyjson_mut_doc *rhs;
  yyjson_mut_doc *pyVar8;
  char *pcVar9;
  yyjson_mut_doc *val;
  ulong uVar10;
  size_t sVar11;
  uint uVar12;
  uint *m_vals;
  yyjson_mut_doc *pyVar13;
  ulong uVar14;
  ulong uVar15;
  yyjson_patch_err *pyVar16;
  bool bVar17;
  ulong *local_70;
  ulong local_68;
  yyjson_patch_err err_tmp;
  
  if (err == (yyjson_patch_err *)0x0) {
    err = &err_tmp;
    err_00 = &err_tmp.ptr;
  }
  else {
    err_00 = &err->ptr;
  }
  (err->ptr).msg = (char *)0x0;
  (err->ptr).pos = 0;
  err->msg = (char *)0x0;
  *(undefined8 *)&err->ptr = 0;
  *(ulong *)err = 0;
  err->idx = 0;
  if (((doc == (yyjson_mut_doc *)0x0) || (orig == (yyjson_mut_val *)0x0)) ||
     (patch == (yyjson_mut_val *)0x0)) {
    if ((err->ptr).code != 6) {
      err->code = 1;
      pcVar9 = "input parameter is NULL";
LAB_0124ea65:
      err->msg = pcVar9;
LAB_0124ea69:
      err->idx = 0;
      return (yyjson_mut_val *)0x0;
    }
    err->code = 2;
    pcVar9 = "input parameter is NULL";
  }
  else {
    if ((patch->tag & 7) == 6) {
      pyVar13 = doc;
      if (orig == (yyjson_mut_val *)0x0 || doc == (yyjson_mut_doc *)0x0) {
        val = (yyjson_mut_doc *)0x0;
        m_vals = (uint *)orig;
      }
      else {
        val = (yyjson_mut_doc *)unsafe_yyjson_mut_val_mut_copy(doc,orig);
        m_vals = (uint *)orig;
      }
      if (val != (yyjson_mut_doc *)0x0) {
        if ((patch->tag & 7) == 6) {
          local_68 = patch->tag >> 8;
          if (0xff < patch->tag) {
            local_70 = (ulong *)(patch->uni).u64;
            goto LAB_0124dcd7;
          }
        }
        else {
          local_68 = 0;
        }
        local_70 = (ulong *)0x0;
LAB_0124dcd7:
        ppcVar4 = &err_00->msg;
        uVar14 = 0;
        do {
          if (uVar14 < local_68) {
            puVar5 = (ulong *)local_70[2];
            uVar14 = uVar14 + 1;
            local_70 = puVar5;
          }
          else {
            puVar5 = (ulong *)0x0;
          }
          if (puVar5 == (ulong *)0x0) {
            return (yyjson_mut_val *)val;
          }
          uVar15 = *puVar5;
          if ((~(uint)uVar15 & 7) != 0) {
            if ((err->ptr).code != 6) {
              err->code = 3;
              pcVar9 = "JSON patch operation is not object";
              goto LAB_0124ddb7;
            }
            err->code = 2;
            pcVar9 = "JSON patch operation is not object";
            goto LAB_0124dd8b;
          }
          if (uVar15 < 0x100) {
LAB_0124dde4:
            pyVar13 = (yyjson_mut_doc *)0x0;
          }
          else {
            puVar6 = (ulong *)puVar5[1];
            uVar10 = uVar15 >> 8;
            bVar17 = false;
            do {
              puVar6 = *(ulong **)(puVar6[2] + 0x10);
              m_vals = (uint *)(*puVar6 & 0xffffffffffffff00);
              if (((yyjson_mut_doc *)m_vals == (yyjson_mut_doc *)0x200) &&
                 (m_vals = (uint *)puVar6[1], *(short *)&((yyjson_mut_doc *)m_vals)->root == 0x706f)
                 ) {
                pyVar13 = (yyjson_mut_doc *)puVar6[2];
                break;
              }
              uVar10 = uVar10 - 1;
              bVar17 = uVar10 == 0;
            } while (!bVar17);
            if (bVar17) goto LAB_0124dde4;
          }
          if (pyVar13 == (yyjson_mut_doc *)0x0) {
            if ((err->ptr).code == 6) {
              err->code = 2;
              pcVar9 = "missing key `op`";
              goto LAB_0124dd8b;
            }
            err->code = 4;
            pcVar9 = "missing key `op`";
LAB_0124ddb7:
            err->msg = pcVar9;
LAB_0124ddc2:
            bVar17 = false;
            sVar11 = 0;
            if (uVar14 != 0) {
              sVar11 = uVar14 - 1;
            }
            err->idx = sVar11;
          }
          else {
            if (((ulong)pyVar13->root & 7) != 5) {
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar9 = "invalid member `op`";
                goto LAB_0124dd8b;
              }
              err->code = 5;
              pcVar9 = "invalid member `op`";
              goto LAB_0124ddb7;
            }
            pVar2 = patch_op_get((yyjson_val *)pyVar13);
            if (uVar15 < 0x100) {
LAB_0124de55:
              pyVar16 = (yyjson_patch_err *)0x0;
            }
            else {
              puVar6 = (ulong *)puVar5[1];
              uVar10 = uVar15 >> 8;
              bVar17 = false;
              do {
                puVar6 = *(ulong **)(puVar6[2] + 0x10);
                m_vals = (uint *)(*puVar6 & 0xffffffffffffff00);
                if (((yyjson_mut_doc *)m_vals == (yyjson_mut_doc *)0x400) &&
                   (m_vals = (uint *)puVar6[1],
                   *(int *)&((yyjson_mut_doc *)m_vals)->root == 0x68746170)) {
                  pyVar16 = (yyjson_patch_err *)puVar6[2];
                  break;
                }
                uVar10 = uVar10 - 1;
                bVar17 = uVar10 == 0;
                pyVar16 = err;
              } while (!bVar17);
              if (bVar17) goto LAB_0124de55;
            }
            if (pyVar16 == (yyjson_patch_err *)0x0) {
              if ((err->ptr).code != 6) {
                err->code = 4;
                pcVar9 = "missing key `path`";
                goto LAB_0124ddb7;
              }
              err->code = 2;
              pcVar9 = "missing key `path`";
LAB_0124dd8b:
              err->msg = pcVar9;
LAB_0124dd8f:
              *(undefined8 *)err_00 = 0;
              err_00->msg = (char *)0x0;
              err_00->pos = 0;
              bVar17 = false;
              goto LAB_0124e45e;
            }
            if ((pyVar16->code & 7) != 5) {
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar9 = "invalid member `path`";
                goto LAB_0124dd8b;
              }
              err->code = 5;
              pcVar9 = "invalid member `path`";
              goto LAB_0124ddb7;
            }
            pyVar13 = *(yyjson_mut_doc **)pyVar16;
            if (pVar2 < PATCH_OP_NONE) {
              if ((0x25U >> (pVar2 & 0x1f) & 1) == 0) {
                puVar6 = (ulong *)0x0;
                pyVar8 = (yyjson_mut_doc *)0x0;
                sVar11 = 0;
                if ((0x18U >> (pVar2 & 0x1f) & 1) == 0) goto LAB_0124dfcc;
                if (uVar15 < 0x100) {
LAB_0124df9a:
                  puVar6 = (ulong *)0x0;
                }
                else {
                  puVar5 = (ulong *)puVar5[1];
                  uVar15 = uVar15 >> 8;
                  bVar17 = false;
                  do {
                    puVar5 = *(ulong **)(puVar5[2] + 0x10);
                    puVar6 = (ulong *)(*puVar5 & 0xffffffffffffff00);
                    if ((puVar6 == (ulong *)0x400) &&
                       (puVar6 = (ulong *)puVar5[1], (uint)*puVar6 == 0x6d6f7266)) {
                      puVar6 = (ulong *)puVar5[2];
                      break;
                    }
                    uVar15 = uVar15 - 1;
                    bVar17 = uVar15 == 0;
                  } while (!bVar17);
                  if (bVar17) goto LAB_0124df9a;
                }
                if (puVar6 != (ulong *)0x0) {
                  if ((*puVar6 & 7) != 5) {
                    if ((err->ptr).code != 6) {
                      err->code = 5;
                      pcVar9 = "invalid member `from`";
                      goto LAB_0124ddb7;
                    }
                    err->code = 2;
                    pcVar9 = "invalid member `from`";
                    goto LAB_0124dd8b;
                  }
                  sVar11 = *puVar6 >> 8;
                  pyVar8 = (yyjson_mut_doc *)0x0;
                  goto LAB_0124dfcc;
                }
                if ((err->ptr).code != 6) {
                  err->code = 4;
                  pcVar9 = "missing key `from`";
                  goto LAB_0124e9a9;
                }
                err->code = 2;
                pcVar9 = "missing key `from`";
LAB_0124e97d:
                err->msg = pcVar9;
                *(undefined8 *)err_00 = 0;
                err_00->msg = (char *)0x0;
                err_00->pos = 0;
                bVar17 = false;
                goto LAB_0124e45e;
              }
              if (uVar15 < 0x100) {
LAB_0124df41:
                m_vals = (uint *)0x0;
              }
              else {
                puVar5 = (ulong *)puVar5[1];
                uVar15 = uVar15 >> 8;
                bVar17 = false;
                do {
                  puVar5 = *(ulong **)(puVar5[2] + 0x10);
                  if (((*puVar5 & 0xffffffffffffff00) == 0x500) &&
                     (uVar12 = *(uint *)puVar5[1] ^ 0x756c6176, m_vals = (uint *)(ulong)uVar12,
                     (char)((uint *)puVar5[1])[1] == 'e' && uVar12 == 0)) {
                    m_vals = (uint *)puVar5[2];
                    break;
                  }
                  uVar15 = uVar15 - 1;
                  bVar17 = uVar15 == 0;
                } while (!bVar17);
                if (bVar17) goto LAB_0124df41;
              }
              if ((yyjson_mut_doc *)m_vals != (yyjson_mut_doc *)0x0) {
                if (doc == (yyjson_mut_doc *)0x0) {
                  pyVar8 = (yyjson_mut_doc *)0x0;
                }
                else {
                  pyVar8 = (yyjson_mut_doc *)
                           unsafe_yyjson_mut_val_mut_copy(doc,(yyjson_mut_val *)m_vals);
                }
                puVar6 = (ulong *)0x0;
                sVar11 = 0;
                if (pyVar8 != (yyjson_mut_doc *)0x0) goto LAB_0124dfcc;
                yVar3 = (err->ptr).code;
                err->code = 2;
                err->msg = "failed to copy value";
                if (yVar3 == 6) goto LAB_0124e43e;
                goto LAB_0124e485;
              }
              if ((err->ptr).code == 6) {
                err->code = 2;
                pcVar9 = "missing key `value`";
                goto LAB_0124e97d;
              }
              err->code = 4;
              pcVar9 = "missing key `value`";
LAB_0124e9a9:
              err->msg = pcVar9;
              goto LAB_0124ddc2;
            }
            puVar6 = (ulong *)0x0;
            pyVar8 = (yyjson_mut_doc *)0x0;
            sVar11 = 0;
LAB_0124dfcc:
            if (pVar2 < PATCH_OP_NONE) {
              uVar15 = (ulong)pyVar13 >> 8;
              m_vals = &switchD_0124dfec::switchdataD_014acebc;
              switch(pVar2) {
              case PATCH_OP_ADD:
                bVar17 = true;
                if ((yyjson_mut_doc *)0xff < pyVar13) {
                  m_vals = (uint *)pyVar16->idx;
                  (err->ptr).code = 0;
                  *ppcVar4 = (char *)0x0;
                  err_00->pos = 0;
                  yVar3 = 1;
                  if ((pyVar8 == (yyjson_mut_doc *)0x0) || (val == (yyjson_mut_doc *)0x0)) {
                    pcVar9 = "input parameter is NULL";
LAB_0124e8db:
                    (err->ptr).code = yVar3;
                    err_00->msg = pcVar9;
                    err_00->pos = 0;
                  }
                  else {
                    pcVar9 = "input parameter is NULL";
                    if ((yyjson_mut_doc *)m_vals == (yyjson_mut_doc *)0x0) goto LAB_0124e8db;
                    if (*(char *)&((yyjson_mut_doc *)m_vals)->root != '/') {
                      yVar3 = 2;
                      pcVar9 = "no prefix \'/\'";
                      goto LAB_0124e8db;
                    }
                    pyVar13 = val;
                    bVar1 = unsafe_yyjson_mut_ptr_putx
                                      ((yyjson_mut_val *)val,(char *)m_vals,uVar15,
                                       (yyjson_mut_val *)pyVar8,doc,false,true,(yyjson_ptr_ctx *)0x0
                                       ,err_00);
                    if (bVar1) break;
                  }
                  yVar3 = (err->ptr).code;
                  goto LAB_0124e8fb;
                }
LAB_0124e600:
                bVar17 = true;
                val = pyVar8;
                break;
              case PATCH_OP_REMOVE:
                m_vals = (uint *)pyVar16->idx;
                (err->ptr).code = 0;
                *ppcVar4 = (char *)0x0;
                err_00->pos = 0;
                yVar3 = 1;
                pcVar9 = "input parameter is NULL";
                if ((val == (yyjson_mut_doc *)0x0) ||
                   ((yyjson_mut_doc *)m_vals == (yyjson_mut_doc *)0x0)) {
LAB_0124e94e:
                  (err->ptr).code = yVar3;
                  err_00->msg = pcVar9;
                  err_00->pos = 0;
                }
                else {
                  if (pyVar13 < (yyjson_mut_doc *)0x100) {
                    yVar3 = 5;
                    pcVar9 = "cannot set root";
                    goto LAB_0124e94e;
                  }
                  if (*(char *)&((yyjson_mut_doc *)m_vals)->root != '/') {
                    yVar3 = 2;
                    pcVar9 = "no prefix \'/\'";
                    goto LAB_0124e94e;
                  }
                  pyVar13 = val;
                  pyVar7 = unsafe_yyjson_mut_ptr_removex
                                     ((yyjson_mut_val *)val,(char *)m_vals,uVar15,
                                      (yyjson_ptr_ctx *)0x0,err_00);
                  bVar17 = true;
                  if (pyVar7 != (yyjson_mut_val *)0x0) break;
                }
                if ((err->ptr).code != 6) {
                  err->code = 7;
                  pcVar9 = "failed to remove `path`";
                  goto LAB_0124e9a9;
                }
                err->code = 2;
                pcVar9 = "failed to remove `path`";
                goto LAB_0124e97d;
              case PATCH_OP_REPLACE:
                bVar17 = true;
                if (pyVar13 < (yyjson_mut_doc *)0x100) goto LAB_0124e600;
                m_vals = (uint *)pyVar16->idx;
                (err->ptr).code = 0;
                *ppcVar4 = (char *)0x0;
                err_00->pos = 0;
                yVar3 = 1;
                if ((pyVar8 == (yyjson_mut_doc *)0x0) || (val == (yyjson_mut_doc *)0x0)) {
                  pcVar9 = "input parameter is NULL";
LAB_0124e887:
                  (err->ptr).code = yVar3;
                  err_00->msg = pcVar9;
                  err_00->pos = 0;
                }
                else {
                  pcVar9 = "input parameter is NULL";
                  if ((yyjson_mut_doc *)m_vals == (yyjson_mut_doc *)0x0) goto LAB_0124e887;
                  if (*(char *)&((yyjson_mut_doc *)m_vals)->root != '/') {
                    yVar3 = 2;
                    pcVar9 = "no prefix \'/\'";
                    goto LAB_0124e887;
                  }
                  pyVar13 = val;
                  pyVar7 = unsafe_yyjson_mut_ptr_replacex
                                     ((yyjson_mut_val *)val,(char *)m_vals,uVar15,
                                      (yyjson_mut_val *)pyVar8,(yyjson_ptr_ctx *)0x0,err_00);
                  if (pyVar7 != (yyjson_mut_val *)0x0) break;
                }
                if ((err->ptr).code != 6) {
                  err->code = 7;
                  pcVar9 = "failed to replace `path`";
                  goto LAB_0124e9a9;
                }
                err->code = 2;
                pcVar9 = "failed to replace `path`";
                goto LAB_0124e97d;
              case PATCH_OP_MOVE:
                pyVar8 = val;
                if (sVar11 == 0 && uVar15 == 0) goto LAB_0124e600;
                m_vals = (uint *)puVar6[1];
                (err->ptr).code = 0;
                *ppcVar4 = (char *)0x0;
                err_00->pos = 0;
                if ((val == (yyjson_mut_doc *)0x0) ||
                   ((yyjson_mut_doc *)m_vals == (yyjson_mut_doc *)0x0)) {
                  (err->ptr).code = 1;
                  pcVar9 = "input parameter is NULL";
LAB_0124e833:
                  err_00->msg = pcVar9;
                  err_00->pos = 0;
                  pyVar8 = (yyjson_mut_doc *)0x0;
                }
                else {
                  if (sVar11 == 0) {
                    (err->ptr).code = 5;
                    pcVar9 = "cannot set root";
                    goto LAB_0124e833;
                  }
                  if (*(char *)&((yyjson_mut_doc *)m_vals)->root != '/') {
                    (err->ptr).code = 2;
                    pcVar9 = "no prefix \'/\'";
                    goto LAB_0124e833;
                  }
                  pyVar8 = (yyjson_mut_doc *)
                           unsafe_yyjson_mut_ptr_removex
                                     ((yyjson_mut_val *)val,(char *)m_vals,sVar11,
                                      (yyjson_ptr_ctx *)0x0,err_00);
                }
                if (pyVar8 == (yyjson_mut_doc *)0x0) {
                  if ((err->ptr).code != 6) {
                    err->code = 7;
                    pcVar9 = "failed to remove `from`";
                    goto LAB_0124ddb7;
                  }
                  err->code = 2;
                  pcVar9 = "failed to remove `from`";
                  goto LAB_0124dd8b;
                }
                if (pyVar13 < (yyjson_mut_doc *)0x100) {
LAB_0124e60a:
                  bVar17 = true;
                  val = pyVar8;
                  break;
                }
                m_vals = (uint *)pyVar16->idx;
                (err->ptr).code = 0;
                *ppcVar4 = (char *)0x0;
                err_00->pos = 0;
                yVar3 = 1;
                pcVar9 = "input parameter is NULL";
                if ((val == (yyjson_mut_doc *)0x0) ||
                   ((yyjson_mut_doc *)m_vals == (yyjson_mut_doc *)0x0)) {
LAB_0124e864:
                  (err->ptr).code = yVar3;
LAB_0124e868:
                  err_00->msg = pcVar9;
                  err_00->pos = 0;
                }
                else {
                  if (*(char *)&((yyjson_mut_doc *)m_vals)->root != '/') {
                    yVar3 = 2;
                    pcVar9 = "no prefix \'/\'";
                    goto LAB_0124e864;
                  }
LAB_0124e2bb:
                  bVar17 = true;
                  pyVar13 = val;
                  bVar1 = unsafe_yyjson_mut_ptr_putx
                                    ((yyjson_mut_val *)val,(char *)m_vals,uVar15,
                                     (yyjson_mut_val *)pyVar8,doc,false,true,(yyjson_ptr_ctx *)0x0,
                                     err_00);
                  if (bVar1) break;
                }
                yVar3 = (err->ptr).code;
LAB_0124e8fb:
                if (yVar3 != 6) {
                  err->code = 7;
                  pcVar9 = "failed to add `path`";
                  goto LAB_0124e9a9;
                }
                err->code = 2;
                pcVar9 = "failed to add `path`";
                goto LAB_0124e97d;
              case PATCH_OP_COPY:
                m_vals = (uint *)puVar6[1];
                (err->ptr).code = 0;
                *ppcVar4 = (char *)0x0;
                err_00->pos = 0;
                if ((val == (yyjson_mut_doc *)0x0) ||
                   ((yyjson_mut_doc *)m_vals == (yyjson_mut_doc *)0x0)) {
                  (err->ptr).code = 1;
                  err_00->msg = "input parameter is NULL";
                  err_00->pos = 0;
                  pyVar8 = (yyjson_mut_doc *)0x0;
                }
                else {
                  pyVar8 = val;
                  if (sVar11 != 0) {
                    if (*(char *)&((yyjson_mut_doc *)m_vals)->root == '/') {
                      pyVar8 = (yyjson_mut_doc *)
                               unsafe_yyjson_mut_ptr_getx
                                         ((yyjson_mut_val *)val,(char *)m_vals,sVar11,
                                          (yyjson_ptr_ctx *)0x0,err_00);
                    }
                    else {
                      (err->ptr).code = 2;
                      err_00->msg = "no prefix \'/\'";
                      err_00->pos = 0;
                      pyVar8 = (yyjson_mut_doc *)0x0;
                    }
                  }
                }
                if (pyVar8 == (yyjson_mut_doc *)0x0) {
                  if ((err->ptr).code != 6) {
                    err->code = 7;
                    pcVar9 = "failed to get `from`";
                    goto LAB_0124ddb7;
                  }
                  err->code = 2;
                  pcVar9 = "failed to get `from`";
                  goto LAB_0124dd8b;
                }
                if (pyVar13 < (yyjson_mut_doc *)0x100) goto LAB_0124e60a;
                if (doc == (yyjson_mut_doc *)0x0) {
                  pyVar8 = (yyjson_mut_doc *)0x0;
                }
                else {
                  m_vals = (uint *)pyVar8;
                  pyVar13 = doc;
                  pyVar8 = (yyjson_mut_doc *)
                           unsafe_yyjson_mut_val_mut_copy(doc,(yyjson_mut_val *)pyVar8);
                }
                if (pyVar8 != (yyjson_mut_doc *)0x0) {
                  m_vals = (uint *)pyVar16->idx;
                  (err->ptr).code = 0;
                  *ppcVar4 = (char *)0x0;
                  err_00->pos = 0;
                  yVar3 = 1;
                  pcVar9 = "input parameter is NULL";
                  if ((val != (yyjson_mut_doc *)0x0) &&
                     ((yyjson_mut_doc *)m_vals != (yyjson_mut_doc *)0x0)) {
                    if (*(char *)&((yyjson_mut_doc *)m_vals)->root != '/') {
                      yVar3 = 2;
                      pcVar9 = "no prefix \'/\'";
                      goto LAB_0124e852;
                    }
                    goto LAB_0124e2bb;
                  }
LAB_0124e852:
                  (err->ptr).code = yVar3;
                  goto LAB_0124e868;
                }
                yVar3 = (err->ptr).code;
                err->code = 2;
                err->msg = "failed to copy value";
                if (yVar3 == 6) goto LAB_0124dd8f;
                goto LAB_0124ddc2;
              case PATCH_OP_TEST:
                m_vals = (uint *)pyVar16->idx;
                (err->ptr).code = 0;
                *ppcVar4 = (char *)0x0;
                err_00->pos = 0;
                if ((val == (yyjson_mut_doc *)0x0) ||
                   ((yyjson_mut_doc *)m_vals == (yyjson_mut_doc *)0x0)) {
                  (err->ptr).code = 1;
                  pcVar9 = "input parameter is NULL";
LAB_0124e808:
                  err_00->msg = pcVar9;
                  err_00->pos = 0;
                  rhs = (yyjson_mut_doc *)0x0;
                }
                else {
                  rhs = val;
                  if ((yyjson_mut_doc *)0xff < pyVar13) {
                    if (*(char *)&((yyjson_mut_doc *)m_vals)->root != '/') {
                      (err->ptr).code = 2;
                      pcVar9 = "no prefix \'/\'";
                      goto LAB_0124e808;
                    }
                    pyVar13 = val;
                    rhs = (yyjson_mut_doc *)
                          unsafe_yyjson_mut_ptr_getx
                                    ((yyjson_mut_val *)val,(char *)m_vals,uVar15,
                                     (yyjson_ptr_ctx *)0x0,err_00);
                  }
                }
                if (rhs == (yyjson_mut_doc *)0x0) {
                  if ((err->ptr).code != 6) {
                    err->code = 7;
                    pcVar9 = "failed to get `path`";
                    goto LAB_0124e9a9;
                  }
                  err->code = 2;
                  pcVar9 = "failed to get `path`";
                  goto LAB_0124e97d;
                }
                if (pyVar8 != (yyjson_mut_doc *)0x0) {
                  bVar1 = unsafe_yyjson_mut_equals((yyjson_mut_val *)pyVar8,(yyjson_mut_val *)rhs);
                  bVar17 = true;
                  m_vals = (uint *)rhs;
                  pyVar13 = pyVar8;
                  if (bVar1) break;
                }
                if ((err->ptr).code != 6) {
                  err->code = 6;
                  err->msg = "failed to test equal";
                  goto LAB_0124e485;
                }
                err->code = 2;
                err->msg = "failed to test equal";
                *(undefined8 *)err_00 = 0;
                err_00->msg = (char *)0x0;
                err_00->pos = 0;
                bVar17 = false;
              }
            }
            else if ((err->ptr).code == 6) {
              err->code = 2;
              err->msg = "unsupported `op`";
LAB_0124e43e:
              *(undefined8 *)err_00 = 0;
              err_00->msg = (char *)0x0;
              err_00->pos = 0;
              bVar17 = false;
            }
            else {
              err->code = 5;
              err->msg = "unsupported `op`";
LAB_0124e485:
              bVar17 = false;
              sVar11 = 0;
              if (uVar14 != 0) {
                sVar11 = uVar14 - 1;
              }
              err->idx = sVar11;
            }
          }
LAB_0124e45e:
          if (!bVar17) {
            return (yyjson_mut_val *)0x0;
          }
        } while( true );
      }
      yVar3 = (err->ptr).code;
      err->code = 2;
      err->msg = "failed to copy value";
      if (yVar3 != 6) goto LAB_0124ea69;
      goto LAB_0124ea27;
    }
    if ((err->ptr).code != 6) {
      err->code = 1;
      pcVar9 = "input patch is not array";
      goto LAB_0124ea65;
    }
    err->code = 2;
    pcVar9 = "input patch is not array";
  }
  err->msg = pcVar9;
LAB_0124ea27:
  *(undefined8 *)err_00 = 0;
  err_00->msg = (char *)0x0;
  err_00->pos = 0;
  return (yyjson_mut_val *)0x0;
}

Assistant:

yyjson_mut_val *yyjson_mut_patch(yyjson_mut_doc *doc,
                                 yyjson_mut_val *orig,
                                 yyjson_mut_val *patch,
                                 yyjson_patch_err *err) {
    yyjson_mut_val *root, *obj;
    yyjson_mut_arr_iter iter;
    yyjson_patch_err err_tmp;
    if (!err) err = &err_tmp;
    memset(err, 0, sizeof(*err));
    memset(&iter, 0, sizeof(iter));

    if (unlikely(!doc || !orig || !patch)) {
        return_err(INVALID_PARAMETER, "input parameter is NULL");
    }
    if (unlikely(!yyjson_mut_is_arr(patch))) {
        return_err(INVALID_PARAMETER, "input patch is not array");
    }
    root = yyjson_mut_val_mut_copy(doc, orig);
    if (unlikely(!root)) return_err_copy();

    /* iterate through the patch array */
    yyjson_mut_arr_iter_init(patch, &iter);
    while ((obj = yyjson_mut_arr_iter_next(&iter))) {
        patch_op op_enum;
        yyjson_mut_val *op, *path, *from = NULL, *value;
        yyjson_mut_val *val = NULL, *test;
        usize path_len, from_len = 0;
        if (!unsafe_yyjson_is_obj(obj)) {
            return_err(INVALID_OPERATION, "JSON patch operation is not object");
        }

        /* get required member: op */
        op = yyjson_mut_obj_get(obj, "op");
        if (unlikely(!op)) return_err_key("`op`");
        if (unlikely(!yyjson_mut_is_str(op))) return_err_val("`op`");
        op_enum = patch_op_get((yyjson_val *)(void *)op);

        /* get required member: path */
        path = yyjson_mut_obj_get(obj, "path");
        if (unlikely(!path)) return_err_key("`path`");
        if (unlikely(!yyjson_mut_is_str(path))) return_err_val("`path`");
        path_len = unsafe_yyjson_get_len(path);

        /* get required member: value, from */
        switch ((int)op_enum) {
            case PATCH_OP_ADD: case PATCH_OP_REPLACE: case PATCH_OP_TEST:
                value = yyjson_mut_obj_get(obj, "value");
                if (unlikely(!value)) return_err_key("`value`");
                val = yyjson_mut_val_mut_copy(doc, value);
                if (unlikely(!val)) return_err_copy();
                break;
            case PATCH_OP_MOVE: case PATCH_OP_COPY:
                from = yyjson_mut_obj_get(obj, "from");
                if (unlikely(!from)) return_err_key("`from`");
                if (unlikely(!yyjson_mut_is_str(from))) {
                    return_err_val("`from`");
                }
                from_len = unsafe_yyjson_get_len(from);
                break;
            default:
                break;
        }

        /* perform an operation */
        switch ((int)op_enum) {
            case PATCH_OP_ADD: /* add(path, val) */
                if (unlikely(path_len == 0)) { root = val; break; }
                if (unlikely(!ptr_add(path, val))) {
                    return_err(POINTER, "failed to add `path`");
                }
                break;
            case PATCH_OP_REMOVE: /* remove(path) */
                if (unlikely(!ptr_remove(path))) {
                    return_err(POINTER, "failed to remove `path`");
                }
                break;
            case PATCH_OP_REPLACE: /* replace(path, val) */
                if (unlikely(path_len == 0)) { root = val; break; }
                if (unlikely(!ptr_replace(path, val))) {
                    return_err(POINTER, "failed to replace `path`");
                }
                break;
            case PATCH_OP_MOVE: /* val = remove(from), add(path, val) */
                if (unlikely(from_len == 0 && path_len == 0)) break;
                val = ptr_remove(from);
                if (unlikely(!val)) {
                    return_err(POINTER, "failed to remove `from`");
                }
                if (unlikely(path_len == 0)) { root = val; break; }
                if (unlikely(!ptr_add(path, val))) {
                    return_err(POINTER, "failed to add `path`");
                }
                break;
            case PATCH_OP_COPY: /* val = get(from).copy, add(path, val) */
                val = ptr_get(from);
                if (unlikely(!val)) {
                    return_err(POINTER, "failed to get `from`");
                }
                if (unlikely(path_len == 0)) { root = val; break; }
                val = yyjson_mut_val_mut_copy(doc, val);
                if (unlikely(!val)) return_err_copy();
                if (unlikely(!ptr_add(path, val))) {
                    return_err(POINTER, "failed to add `path`");
                }
                break;
            case PATCH_OP_TEST: /* test = get(path), test.eq(val) */
                test = ptr_get(path);
                if (unlikely(!test)) {
                    return_err(POINTER, "failed to get `path`");
                }
                if (unlikely(!yyjson_mut_equals(val, test))) {
                    return_err(EQUAL, "failed to test equal");
                }
                break;
            default:
                return_err(INVALID_MEMBER, "unsupported `op`");
        }
    }
    return root;
}